

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.hpp
# Opt level: O0

void __thiscall
ylt::metric::basic_static_histogram<long>::basic_static_histogram
          (basic_static_histogram<long> *this,string *name,string *help,
          vector<double,_std::allocator<double>_> *buckets,size_t dupli_count)

{
  unsigned_long *in_RDX;
  char (*in_RDI) [1];
  string *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  MetricType MVar1;
  static_metric *in_stack_ffffffffffffff50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_static_histogram<long> *this_00;
  
  MVar1 = (MetricType)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffffb8;
  std::__cxx11::string::string(in_stack_ffffffffffffff80,__str);
  this_00 = (basic_static_histogram<long> *)&stack0xffffffffffffff98;
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,__str);
  static_metric::metric_t
            (in_stack_ffffffffffffff50,MVar1,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string(in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(in_stack_ffffffffffffff40);
  *(undefined ***)in_RDI = &PTR__basic_static_histogram_00329e88;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40,
             (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
  std::
  vector<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
  ::vector((vector<std::shared_ptr<ylt::metric::basic_static_counter<long>_>,_std::allocator<std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>_>
            *)0x1a0db9);
  std::
  make_shared<ylt::metric::basic_static_gauge<long>,char_const(&)[1],char_const(&)[1],unsigned_long&>
            ((char (*) [1])__str,in_RDI,in_RDX);
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xb8));
  init_bucket_counter(this_00,(size_t)__str,(size_t)in_RDI);
  return;
}

Assistant:

basic_static_histogram(std::string name, std::string help,
                         std::vector<double> buckets, size_t dupli_count = 2)
      : bucket_boundaries_(std::move(buckets)),
        static_metric(MetricType::Histogram, std::move(name), std::move(help)),
        sum_(std::make_shared<gauge_t>("", "", dupli_count)) {
    init_bucket_counter(dupli_count, bucket_boundaries_.size());
  }